

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O1

int y4m_input_open(y4m_input *y4m_ctx,FILE *file,char *skip_buffer,int num_skip,
                  aom_chroma_sample_position_t csp,int only_420)

{
  byte *pbVar1;
  byte *__s1;
  byte bVar2;
  bool bVar3;
  aom_chroma_sample_position_t aVar4;
  int iVar5;
  code *pcVar6;
  uchar *__ptr;
  uchar *puVar7;
  int iVar8;
  int *piVar9;
  int *piVar10;
  y4m_input *pyVar11;
  char *__s1_00;
  int iVar12;
  char *__format;
  size_t sVar13;
  long lVar14;
  byte *pbVar15;
  size_t __n;
  char tag_buffer [9];
  byte local_17d;
  char local_175;
  undefined7 uStack_174;
  char local_16d;
  aom_chroma_sample_position_t local_16c;
  char *local_168;
  int *local_160;
  y4m_input *local_158;
  int *local_150;
  int *local_148;
  int *local_140;
  byte local_138 [264];
  
  local_16c = csp;
  if (0 < num_skip) {
    memcpy(&local_175,skip_buffer,(ulong)(uint)num_skip);
  }
  iVar5 = file_read(&local_175 + num_skip,(long)(9 - num_skip),file);
  if (iVar5 == 0) {
    return -1;
  }
  if (local_16d != '2' || CONCAT71(uStack_174,local_175) != 0x4745504d34565559) {
    y4m_input_open_cold_1();
    return -1;
  }
  iVar5 = file_read(&local_175,1,file);
  if ((iVar5 == 0) || (local_175 != ' ')) {
    y4m_input_open_cold_17();
    return -1;
  }
  y4m_ctx->pic_w = -1;
  y4m_ctx->pic_h = -1;
  local_158 = (y4m_input *)&y4m_ctx->pic_h;
  local_160 = &y4m_ctx->fps_n;
  y4m_ctx->fps_n = -1;
  local_140 = &y4m_ctx->par_n;
  y4m_ctx->par_n = 0;
  y4m_ctx->par_d = 0;
  local_148 = &y4m_ctx->par_d;
  y4m_ctx->interlace = '?';
  y4m_ctx->color_range = AOM_CR_STUDIO_RANGE;
  local_168 = y4m_ctx->chroma_type;
  builtin_strncpy(y4m_ctx->chroma_type,"420",4);
  local_150 = &y4m_ctx->fps_d;
LAB_00123179:
  while( true ) {
    iVar5 = file_read(local_138,1,file);
    bVar3 = true;
    if (iVar5 == 0) break;
    if (local_138[0] != 0x20) {
      if (local_138[0] != 10) {
        lVar14 = 1;
        while( true ) {
          iVar5 = file_read(local_138 + lVar14,1,file);
          if (iVar5 == 0) break;
          bVar2 = local_138[lVar14];
          if ((bVar2 == 10) || (bVar2 == 0x20)) goto LAB_001231ed;
          lVar14 = lVar14 + 1;
          if (lVar14 == 0x100) goto code_r0x001231e7;
        }
        break;
      }
      local_138[0] = 0;
      local_17d = 10;
      goto LAB_00123209;
    }
  }
  goto LAB_0012320b;
code_r0x001231e7:
  lVar14 = 0x100;
LAB_001231ed:
  if (lVar14 == 0x100) {
    y4m_input_open_cold_2();
  }
  else {
    local_17d = local_138[lVar14];
    local_138[lVar14] = 0;
LAB_00123209:
    bVar3 = false;
  }
LAB_0012320b:
  if (bVar3) goto LAB_0012375b;
  pbVar1 = local_138;
switchD_0012325f_caseD_42:
  while (pbVar15 = pbVar1, __s1_00 = local_168, aVar4 = local_16c, bVar2 = *pbVar15, bVar2 == 0x20)
  {
    pbVar1 = pbVar15 + 1;
  }
  if (bVar2 != 0) {
    __s1 = pbVar15 + 1;
    for (__n = 0; (__s1[__n] & 0xdf) != 0; __n = __n + 1) {
    }
    pbVar1 = __s1 + __n;
    switch(bVar2) {
    case 0x41:
      piVar9 = local_148;
      piVar10 = local_140;
      break;
    case 0x42:
    case 0x44:
    case 0x45:
    case 0x47:
      goto switchD_0012325f_caseD_42;
    case 0x43:
      if (0x10 < (long)(__n + 1)) goto LAB_0012375b;
      memcpy(local_168,__s1,__n);
      y4m_ctx->chroma_type[__n] = '\0';
      goto switchD_0012325f_caseD_42;
    case 0x46:
      piVar9 = local_150;
      piVar10 = local_160;
      break;
    case 0x48:
      pyVar11 = local_158;
      goto LAB_0012335c;
    case 0x49:
      y4m_ctx->interlace = *__s1;
      goto switchD_0012325f_caseD_42;
    default:
      pyVar11 = y4m_ctx;
      if (bVar2 == 0x57) {
LAB_0012335c:
        iVar5 = __isoc99_sscanf(__s1,"%d",pyVar11);
        if (iVar5 != 1) goto LAB_0012375b;
      }
      else if ((bVar2 == 0x58) && (iVar5 = strncmp((char *)__s1,"COLORRANGE=",0xb), iVar5 == 0)) {
        pbVar15 = pbVar15 + 0xc;
        iVar5 = strcmp((char *)pbVar15,"LIMITED");
        if (iVar5 != 0) {
          iVar5 = strcmp((char *)pbVar15,"FULL");
          if (iVar5 != 0) {
            fprintf(_stderr,"Unknown color range value: %s\n",pbVar15);
            goto LAB_0012375b;
          }
          y4m_ctx->color_range = AOM_CR_FULL_RANGE;
        }
      }
      goto switchD_0012325f_caseD_42;
    }
    iVar5 = __isoc99_sscanf(__s1,"%d:%d",piVar10,piVar9);
    if (iVar5 != 2) goto LAB_0012375b;
    goto switchD_0012325f_caseD_42;
  }
  if (local_17d == 10) goto LAB_0012338d;
  goto LAB_00123179;
LAB_0012338d:
  if (y4m_ctx->pic_w == -1) {
    y4m_input_open_cold_16();
  }
  else if (local_158->pic_w == -1) {
    y4m_input_open_cold_15();
  }
  else {
    if (*local_160 != -1) {
      if (y4m_ctx->interlace != 'p') {
        if (y4m_ctx->interlace != '?') {
          y4m_input_open_cold_13();
          return -1;
        }
        y4m_input_open_cold_3();
      }
      if ((aVar4 == AOM_CSP_VERTICAL) && (iVar5 = strcmp(__s1_00,"420mpeg2"), iVar5 != 0)) {
        y4m_input_open_cold_4();
        return -1;
      }
      if (aVar4 == AOM_CSP_COLOCATED) {
        y4m_input_open_cold_5();
      }
      y4m_ctx->aom_fmt = AOM_IMG_FMT_I420;
      y4m_ctx->bps = 0xc;
      y4m_ctx->bit_depth = 8;
      y4m_ctx->dst_buf = (uchar *)0x0;
      y4m_ctx->aux_buf = (uchar *)0x0;
      iVar5 = strcmp(__s1_00,"420");
      if (((iVar5 == 0) || (iVar5 = strcmp(__s1_00,"420jpeg"), iVar5 == 0)) ||
         (iVar5 = strcmp(__s1_00,"420mpeg2"), iVar5 == 0)) {
        y4m_ctx->src_c_dec_h = 2;
        y4m_ctx->src_c_dec_v = 2;
        y4m_ctx->dst_c_dec_h = 2;
        y4m_ctx->dst_c_dec_v = 2;
        iVar5 = y4m_ctx->pic_w;
        iVar8 = y4m_ctx->pic_h;
        sVar13 = (size_t)(int)(iVar8 * iVar5 +
                              ((iVar8 - (iVar8 + 1 >> 0x1f)) + 1U >> 1) *
                              ((iVar5 - (iVar5 + 1 >> 0x1f)) + 1U >> 1) * 2);
LAB_001235ed:
        y4m_ctx->dst_buf_read_sz = sVar13;
        y4m_ctx->aux_buf_sz = 0;
        y4m_ctx->aux_buf_read_sz = 0;
        pcVar6 = y4m_convert_null;
      }
      else {
        iVar5 = strcmp(__s1_00,"420p10");
        if (iVar5 == 0) {
          y4m_ctx->src_c_dec_h = 2;
          y4m_ctx->src_c_dec_v = 2;
          y4m_ctx->dst_c_dec_h = 2;
          y4m_ctx->dst_c_dec_v = 2;
          iVar5 = y4m_ctx->pic_w;
          iVar8 = y4m_ctx->pic_h;
          y4m_ctx->dst_buf_read_sz =
               (long)(int)((iVar8 * iVar5 +
                           ((iVar8 - (iVar8 + 1 >> 0x1f)) + 1U >> 1) *
                           ((iVar5 - (iVar5 + 1 >> 0x1f)) + 1U >> 1) * 2) * 2);
          y4m_ctx->aux_buf_sz = 0;
          y4m_ctx->aux_buf_read_sz = 0;
          y4m_ctx->convert = y4m_convert_null;
          y4m_ctx->bit_depth = 10;
          y4m_ctx->aom_fmt = AOM_IMG_FMT_I42016;
          y4m_ctx->bps = 0xf;
          if (only_420 != 0) {
            y4m_input_open_cold_12();
            return -1;
          }
          goto LAB_00123604;
        }
        iVar5 = strcmp(__s1_00,"420p12");
        if (iVar5 == 0) {
          y4m_ctx->src_c_dec_h = 2;
          y4m_ctx->src_c_dec_v = 2;
          y4m_ctx->dst_c_dec_h = 2;
          y4m_ctx->dst_c_dec_v = 2;
          iVar5 = y4m_ctx->pic_w;
          iVar8 = y4m_ctx->pic_h;
          y4m_ctx->dst_buf_read_sz =
               (long)(int)((iVar8 * iVar5 +
                           ((iVar8 - (iVar8 + 1 >> 0x1f)) + 1U >> 1) *
                           ((iVar5 - (iVar5 + 1 >> 0x1f)) + 1U >> 1) * 2) * 2);
          y4m_ctx->aux_buf_sz = 0;
          y4m_ctx->aux_buf_read_sz = 0;
          y4m_ctx->convert = y4m_convert_null;
          y4m_ctx->bit_depth = 0xc;
          y4m_ctx->aom_fmt = AOM_IMG_FMT_I42016;
          y4m_ctx->bps = 0x12;
          if (only_420 != 0) {
            y4m_input_open_cold_11();
            return -1;
          }
          goto LAB_00123604;
        }
        iVar5 = strcmp(__s1_00,"420paldv");
        if (iVar5 == 0) {
          y4m_ctx->src_c_dec_h = 2;
          y4m_ctx->src_c_dec_v = 2;
          y4m_ctx->dst_c_dec_h = 2;
          y4m_ctx->dst_c_dec_v = 2;
          iVar5 = y4m_ctx->pic_w;
          iVar8 = y4m_ctx->pic_h;
          y4m_ctx->dst_buf_read_sz = (long)(iVar8 * iVar5);
          iVar5 = ((iVar8 - (iVar8 + 1 >> 0x1f)) + 1 >> 1) *
                  ((iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1);
          y4m_ctx->aux_buf_sz = (long)(iVar5 * 3);
          y4m_ctx->aux_buf_read_sz = (long)(iVar5 * 2);
          pcVar6 = y4m_convert_42xpaldv_42xjpeg;
        }
        else {
          iVar5 = strcmp(__s1_00,"422jpeg");
          if (iVar5 == 0) {
            y4m_ctx->src_c_dec_h = 2;
            y4m_ctx->src_c_dec_v = 1;
            y4m_ctx->dst_c_dec_h = 2;
            y4m_ctx->dst_c_dec_v = 2;
            iVar5 = y4m_ctx->pic_w;
            y4m_ctx->dst_buf_read_sz = (long)(y4m_ctx->pic_h * iVar5);
            sVar13 = (size_t)(int)(((iVar5 - (iVar5 + 1 >> 0x1f)) + 1U >> 1) * y4m_ctx->pic_h * 2);
            y4m_ctx->aux_buf_read_sz = sVar13;
            y4m_ctx->aux_buf_sz = sVar13;
            pcVar6 = y4m_convert_422jpeg_420jpeg;
          }
          else {
            iVar5 = strcmp(__s1_00,"422");
            if (iVar5 == 0) {
              y4m_ctx->src_c_dec_h = 2;
              y4m_ctx->src_c_dec_v = 1;
              if (only_420 == 0) {
                y4m_ctx->aom_fmt = AOM_IMG_FMT_I422;
                y4m_ctx->bps = 0x10;
                y4m_ctx->dst_c_dec_h = 2;
                y4m_ctx->dst_c_dec_v = 1;
                iVar5 = y4m_ctx->pic_w;
                sVar13 = (size_t)(int)((((iVar5 - (iVar5 + 1 >> 0x1f)) + 1U & 0xfffffffe) + iVar5) *
                                      y4m_ctx->pic_h);
                goto LAB_001235ed;
              }
              y4m_ctx->dst_c_dec_h = 2;
              y4m_ctx->dst_c_dec_v = 2;
              iVar5 = y4m_ctx->pic_w;
              iVar8 = ((iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1) * y4m_ctx->pic_h;
              y4m_ctx->dst_buf_read_sz = (long)(y4m_ctx->pic_h * iVar5);
              sVar13 = (size_t)(iVar8 * 2);
              y4m_ctx->aux_buf_read_sz = sVar13;
              y4m_ctx->aux_buf_sz = (long)iVar8 + sVar13;
              pcVar6 = y4m_convert_422_420jpeg;
            }
            else {
              iVar5 = strcmp(__s1_00,"422p10");
              if (iVar5 == 0) {
                y4m_ctx->aom_fmt = AOM_IMG_FMT_I42216;
                y4m_ctx->bps = 0x14;
                y4m_ctx->bit_depth = 10;
                y4m_ctx->src_c_dec_h = 2;
                y4m_ctx->src_c_dec_v = 1;
                y4m_ctx->dst_c_dec_h = 2;
                y4m_ctx->dst_c_dec_v = 1;
                iVar5 = y4m_ctx->pic_w;
                y4m_ctx->dst_buf_read_sz =
                     (long)(int)((((iVar5 - (iVar5 + 1 >> 0x1f)) + 1U & 0x7ffffffe) + iVar5) *
                                 y4m_ctx->pic_h * 2);
                y4m_ctx->aux_buf_sz = 0;
                y4m_ctx->aux_buf_read_sz = 0;
                y4m_ctx->convert = y4m_convert_null;
                if (only_420 != 0) {
                  y4m_input_open_cold_10();
                  return -1;
                }
                goto LAB_00123604;
              }
              iVar5 = strcmp(__s1_00,"422p12");
              if (iVar5 == 0) {
                y4m_ctx->aom_fmt = AOM_IMG_FMT_I42216;
                y4m_ctx->bps = 0x18;
                y4m_ctx->bit_depth = 0xc;
                y4m_ctx->src_c_dec_h = 2;
                y4m_ctx->src_c_dec_v = 1;
                y4m_ctx->dst_c_dec_h = 2;
                y4m_ctx->dst_c_dec_v = 1;
                iVar5 = y4m_ctx->pic_w;
                y4m_ctx->dst_buf_read_sz =
                     (long)(int)((((iVar5 - (iVar5 + 1 >> 0x1f)) + 1U & 0x7ffffffe) + iVar5) *
                                 y4m_ctx->pic_h * 2);
                y4m_ctx->aux_buf_sz = 0;
                y4m_ctx->aux_buf_read_sz = 0;
                y4m_ctx->convert = y4m_convert_null;
                if (only_420 != 0) {
                  y4m_input_open_cold_9();
                  return -1;
                }
                goto LAB_00123604;
              }
              iVar5 = strcmp(__s1_00,"411");
              if (iVar5 == 0) {
                y4m_ctx->src_c_dec_h = 4;
                y4m_ctx->src_c_dec_v = 1;
                y4m_ctx->dst_c_dec_h = 2;
                y4m_ctx->dst_c_dec_v = 2;
                iVar5 = y4m_ctx->pic_w;
                iVar8 = y4m_ctx->pic_h;
                y4m_ctx->dst_buf_read_sz = (long)(iVar8 * iVar5);
                iVar12 = iVar5 + 6;
                if (-1 < iVar5 + 3) {
                  iVar12 = iVar5 + 3;
                }
                sVar13 = (size_t)((iVar12 >> 2) * iVar8 * 2);
                y4m_ctx->aux_buf_read_sz = sVar13;
                y4m_ctx->aux_buf_sz =
                     (long)(((iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1) * iVar8) + sVar13;
                pcVar6 = y4m_convert_411_420jpeg;
              }
              else {
                iVar5 = strcmp(__s1_00,"444");
                if (iVar5 == 0) {
                  y4m_ctx->src_c_dec_h = 1;
                  y4m_ctx->src_c_dec_v = 1;
                  if (only_420 == 0) {
                    y4m_ctx->aom_fmt = AOM_IMG_FMT_I444;
                    y4m_ctx->bps = 0x18;
                    y4m_ctx->dst_c_dec_h = 1;
                    y4m_ctx->dst_c_dec_v = 1;
                    sVar13 = (long)y4m_ctx->pic_h * (long)y4m_ctx->pic_w * 3;
                    goto LAB_001235ed;
                  }
                  y4m_ctx->dst_c_dec_h = 2;
                  y4m_ctx->dst_c_dec_v = 2;
                  iVar5 = y4m_ctx->pic_w;
                  iVar8 = y4m_ctx->pic_h * iVar5;
                  y4m_ctx->dst_buf_read_sz = (long)iVar8;
                  sVar13 = (size_t)(iVar8 * 2);
                  y4m_ctx->aux_buf_read_sz = sVar13;
                  y4m_ctx->aux_buf_sz =
                       (long)(((iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1) * y4m_ctx->pic_h) + sVar13;
                }
                else {
                  iVar5 = strcmp(__s1_00,"444p10");
                  if (iVar5 == 0) {
                    y4m_ctx->aom_fmt = AOM_IMG_FMT_I44416;
                    y4m_ctx->bps = 0x1e;
                    y4m_ctx->bit_depth = 10;
                    y4m_ctx->src_c_dec_h = 1;
                    y4m_ctx->src_c_dec_v = 1;
                    y4m_ctx->dst_c_dec_h = 1;
                    y4m_ctx->dst_c_dec_v = 1;
                    y4m_ctx->dst_buf_read_sz = (long)y4m_ctx->pic_h * (long)y4m_ctx->pic_w * 6;
                    y4m_ctx->aux_buf_sz = 0;
                    y4m_ctx->aux_buf_read_sz = 0;
                    y4m_ctx->convert = y4m_convert_null;
                    if (only_420 != 0) {
                      y4m_input_open_cold_8();
                      return -1;
                    }
                    goto LAB_00123604;
                  }
                  iVar5 = strcmp(__s1_00,"444p12");
                  if (iVar5 == 0) {
                    y4m_ctx->aom_fmt = AOM_IMG_FMT_I44416;
                    y4m_ctx->bps = 0x24;
                    y4m_ctx->bit_depth = 0xc;
                    y4m_ctx->src_c_dec_h = 1;
                    y4m_ctx->src_c_dec_v = 1;
                    y4m_ctx->dst_c_dec_h = 1;
                    y4m_ctx->dst_c_dec_v = 1;
                    y4m_ctx->dst_buf_read_sz = (long)y4m_ctx->pic_h * (long)y4m_ctx->pic_w * 6;
                    y4m_ctx->aux_buf_sz = 0;
                    y4m_ctx->aux_buf_read_sz = 0;
                    y4m_ctx->convert = y4m_convert_null;
                    if (only_420 != 0) {
                      y4m_input_open_cold_7();
                      return -1;
                    }
                    goto LAB_00123604;
                  }
                  iVar5 = strcmp(__s1_00,"444alpha");
                  if (iVar5 != 0) {
                    iVar5 = strcmp(__s1_00,"mono");
                    if (iVar5 != 0) {
                      __format = "Unknown chroma sampling type: %s\n";
                      goto LAB_00123773;
                    }
                    y4m_ctx->src_c_dec_h = 0;
                    y4m_ctx->src_c_dec_v = 0;
                    y4m_ctx->dst_c_dec_h = 2;
                    y4m_ctx->dst_c_dec_v = 2;
                    y4m_ctx->dst_buf_read_sz = (long)y4m_ctx->pic_h * (long)y4m_ctx->pic_w;
                    y4m_ctx->aux_buf_sz = 0;
                    y4m_ctx->aux_buf_read_sz = 0;
                    pcVar6 = y4m_convert_mono_420jpeg;
                    goto LAB_00123600;
                  }
                  y4m_ctx->src_c_dec_h = 1;
                  y4m_ctx->src_c_dec_v = 1;
                  if (only_420 == 0) {
                    y4m_input_open_cold_6();
                    return -1;
                  }
                  y4m_ctx->dst_c_dec_h = 2;
                  y4m_ctx->dst_c_dec_v = 2;
                  iVar5 = y4m_ctx->pic_h * y4m_ctx->pic_w;
                  y4m_ctx->dst_buf_read_sz = (long)iVar5;
                  sVar13 = (size_t)(iVar5 * 3);
                  y4m_ctx->aux_buf_read_sz = sVar13;
                  y4m_ctx->aux_buf_sz = sVar13;
                }
                pcVar6 = y4m_convert_444_420jpeg;
              }
            }
          }
        }
      }
LAB_00123600:
      y4m_ctx->convert = pcVar6;
LAB_00123604:
      sVar13 = (size_t)(y4m_ctx->pic_h * y4m_ctx->pic_w +
                       ((y4m_ctx->pic_h + y4m_ctx->dst_c_dec_v + -1) / y4m_ctx->dst_c_dec_v) *
                       ((y4m_ctx->pic_w + y4m_ctx->dst_c_dec_h + -1) / y4m_ctx->dst_c_dec_h) * 2);
      y4m_ctx->dst_buf_sz = sVar13;
      __ptr = (uchar *)malloc(sVar13 << (y4m_ctx->bit_depth != 8));
      y4m_ctx->dst_buf = __ptr;
      if (__ptr == (uchar *)0x0) {
        return -1;
      }
      if (y4m_ctx->aux_buf_sz != 0) {
        puVar7 = (uchar *)malloc(y4m_ctx->aux_buf_sz);
        y4m_ctx->aux_buf = puVar7;
        if (puVar7 == (uchar *)0x0) {
          free(__ptr);
          return -1;
        }
        return 0;
      }
      return 0;
    }
    y4m_input_open_cold_14();
  }
LAB_0012375b:
  __format = "Error parsing %s header.\n";
  __s1_00 = "YUV4MPEG2";
LAB_00123773:
  fprintf(_stderr,__format,__s1_00);
  return -1;
}

Assistant:

int y4m_input_open(y4m_input *y4m_ctx, FILE *file, char *skip_buffer,
                   int num_skip, aom_chroma_sample_position_t csp,
                   int only_420) {
  // File must start with |TAG|.
  char tag_buffer[9];  // 9 == strlen(TAG)
  // Read as much as possible from |skip_buffer|, which were characters
  // that were previously read from the file to do input-type detection.
  assert(num_skip >= 0 && num_skip <= 8);
  if (num_skip > 0) {
    memcpy(tag_buffer, skip_buffer, num_skip);
  }
  // Start reading from the file now that the |skip_buffer| is depleted.
  if (!file_read(tag_buffer + num_skip, 9 - num_skip, file)) {
    return -1;
  }
  if (memcmp(TAG, tag_buffer, 9) != 0) {
    fprintf(stderr, "Error parsing header: must start with %s\n", TAG);
    return -1;
  }
  // Next character must be a space.
  if (!file_read(tag_buffer, 1, file) || tag_buffer[0] != ' ') {
    fprintf(stderr, "Error parsing header: space must follow %s\n", TAG);
    return -1;
  }
  if (!parse_tags(y4m_ctx, file)) {
    fprintf(stderr, "Error parsing %s header.\n", TAG);
    return -1;
  }
  if (y4m_ctx->interlace == '?') {
    fprintf(stderr,
            "Warning: Input video interlacing format unknown; "
            "assuming progressive scan.\n");
  } else if (y4m_ctx->interlace != 'p') {
    fprintf(stderr,
            "Input video is interlaced; "
            "Only progressive scan handled.\n");
    return -1;
  }
  /* Only support vertical chroma sample position if the input format is
   * already 420mpeg2. Colocated is not supported in Y4M.
   */
  if (csp == AOM_CSP_VERTICAL &&
      strcmp(y4m_ctx->chroma_type, "420mpeg2") != 0) {
    fprintf(stderr,
            "Vertical chroma sample position only supported "
            "for 420mpeg2 input\n");
    return -1;
  }
  if (csp == AOM_CSP_COLOCATED) {
    // TODO(any): check the right way to handle this in y4m
    fprintf(stderr,
            "Ignoring colocated chroma sample position for reading in Y4M\n");
  }
  y4m_ctx->aom_fmt = AOM_IMG_FMT_I420;
  y4m_ctx->bps = 12;
  y4m_ctx->bit_depth = 8;
  y4m_ctx->aux_buf = NULL;
  y4m_ctx->dst_buf = NULL;
  if (strcmp(y4m_ctx->chroma_type, "420") == 0 ||
      strcmp(y4m_ctx->chroma_type, "420jpeg") == 0 ||
      strcmp(y4m_ctx->chroma_type, "420mpeg2") == 0) {
    y4m_ctx->src_c_dec_h = y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_v =
        y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz =
        y4m_ctx->pic_w * y4m_ctx->pic_h +
        2 * ((y4m_ctx->pic_w + 1) / 2) * ((y4m_ctx->pic_h + 1) / 2);
    /* Natively supported: no conversion required. */
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
  } else if (strcmp(y4m_ctx->chroma_type, "420p10") == 0) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->dst_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 2;
    y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz =
        2 * (y4m_ctx->pic_w * y4m_ctx->pic_h +
             2 * ((y4m_ctx->pic_w + 1) / 2) * ((y4m_ctx->pic_h + 1) / 2));
    /* Natively supported: no conversion required. */
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    y4m_ctx->bit_depth = 10;
    y4m_ctx->bps = 15;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I42016;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 420p10 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "420p12") == 0) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->dst_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 2;
    y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz =
        2 * (y4m_ctx->pic_w * y4m_ctx->pic_h +
             2 * ((y4m_ctx->pic_w + 1) / 2) * ((y4m_ctx->pic_h + 1) / 2));
    /* Natively supported: no conversion required. */
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    y4m_ctx->bit_depth = 12;
    y4m_ctx->bps = 18;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I42016;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 420p12 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "420paldv") == 0) {
    y4m_ctx->src_c_dec_h = y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_v =
        y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
    /*Chroma filter required: read into the aux buf first.
      We need to make two filter passes, so we need some extra space in the
       aux buffer.*/
    y4m_ctx->aux_buf_sz =
        3 * ((y4m_ctx->pic_w + 1) / 2) * ((y4m_ctx->pic_h + 1) / 2);
    y4m_ctx->aux_buf_read_sz =
        2 * ((y4m_ctx->pic_w + 1) / 2) * ((y4m_ctx->pic_h + 1) / 2);
    y4m_ctx->convert = y4m_convert_42xpaldv_42xjpeg;
  } else if (strcmp(y4m_ctx->chroma_type, "422jpeg") == 0) {
    y4m_ctx->src_c_dec_h = y4m_ctx->dst_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
    /*Chroma filter required: read into the aux buf first.*/
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz =
        2 * ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
    y4m_ctx->convert = y4m_convert_422jpeg_420jpeg;
  } else if (strcmp(y4m_ctx->chroma_type, "422") == 0) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 1;
    if (only_420) {
      y4m_ctx->dst_c_dec_h = 2;
      y4m_ctx->dst_c_dec_v = 2;
      y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
      /*Chroma filter required: read into the aux buf first.
        We need to make two filter passes, so we need some extra space in the
         aux buffer.*/
      y4m_ctx->aux_buf_read_sz =
          2 * ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
      y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz +
                            ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
      y4m_ctx->convert = y4m_convert_422_420jpeg;
    } else {
      y4m_ctx->aom_fmt = AOM_IMG_FMT_I422;
      y4m_ctx->bps = 16;
      y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
      y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
      y4m_ctx->dst_buf_read_sz =
          y4m_ctx->pic_w * y4m_ctx->pic_h +
          2 * ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
      /*Natively supported: no conversion required.*/
      y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
      y4m_ctx->convert = y4m_convert_null;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "422p10") == 0) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I42216;
    y4m_ctx->bps = 20;
    y4m_ctx->bit_depth = 10;
    y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
    y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
    y4m_ctx->dst_buf_read_sz =
        2 * (y4m_ctx->pic_w * y4m_ctx->pic_h +
             2 * ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h);
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 422p10 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "422p12") == 0) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I42216;
    y4m_ctx->bps = 24;
    y4m_ctx->bit_depth = 12;
    y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
    y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
    y4m_ctx->dst_buf_read_sz =
        2 * (y4m_ctx->pic_w * y4m_ctx->pic_h +
             2 * ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h);
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 422p12 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "411") == 0) {
    y4m_ctx->src_c_dec_h = 4;
    y4m_ctx->dst_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
    /*Chroma filter required: read into the aux buf first.
      We need to make two filter passes, so we need some extra space in the
       aux buffer.*/
    y4m_ctx->aux_buf_read_sz = 2 * ((y4m_ctx->pic_w + 3) / 4) * y4m_ctx->pic_h;
    y4m_ctx->aux_buf_sz =
        y4m_ctx->aux_buf_read_sz + ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
    y4m_ctx->convert = y4m_convert_411_420jpeg;
  } else if (strcmp(y4m_ctx->chroma_type, "444") == 0) {
    y4m_ctx->src_c_dec_h = 1;
    y4m_ctx->src_c_dec_v = 1;
    if (only_420) {
      y4m_ctx->dst_c_dec_h = 2;
      y4m_ctx->dst_c_dec_v = 2;
      y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
      /*Chroma filter required: read into the aux buf first.
        We need to make two filter passes, so we need some extra space in the
         aux buffer.*/
      y4m_ctx->aux_buf_read_sz = 2 * y4m_ctx->pic_w * y4m_ctx->pic_h;
      y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz +
                            ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
      y4m_ctx->convert = y4m_convert_444_420jpeg;
    } else {
      y4m_ctx->aom_fmt = AOM_IMG_FMT_I444;
      y4m_ctx->bps = 24;
      y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
      y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
      y4m_ctx->dst_buf_read_sz = 3 * y4m_ctx->pic_w * y4m_ctx->pic_h;
      /*Natively supported: no conversion required.*/
      y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
      y4m_ctx->convert = y4m_convert_null;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "444p10") == 0) {
    y4m_ctx->src_c_dec_h = 1;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I44416;
    y4m_ctx->bps = 30;
    y4m_ctx->bit_depth = 10;
    y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
    y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
    y4m_ctx->dst_buf_read_sz = 2 * 3 * y4m_ctx->pic_w * y4m_ctx->pic_h;
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 444p10 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "444p12") == 0) {
    y4m_ctx->src_c_dec_h = 1;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I44416;
    y4m_ctx->bps = 36;
    y4m_ctx->bit_depth = 12;
    y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
    y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
    y4m_ctx->dst_buf_read_sz = 2 * 3 * y4m_ctx->pic_w * y4m_ctx->pic_h;
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 444p12 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "444alpha") == 0) {
    y4m_ctx->src_c_dec_h = 1;
    y4m_ctx->src_c_dec_v = 1;
    if (only_420) {
      y4m_ctx->dst_c_dec_h = 2;
      y4m_ctx->dst_c_dec_v = 2;
      y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
      /*Chroma filter required: read into the aux buf first.
        We need to make two filter passes, so we need some extra space in the
         aux buffer.
        The extra plane also gets read into the aux buf.
        It will be discarded.*/
      y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz =
          3 * y4m_ctx->pic_w * y4m_ctx->pic_h;
      y4m_ctx->convert = y4m_convert_444_420jpeg;
    } else {
      fprintf(stderr, "Unsupported format: 444A\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "mono") == 0) {
    y4m_ctx->src_c_dec_h = y4m_ctx->src_c_dec_v = 0;
    y4m_ctx->dst_c_dec_h = y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
    /*No extra space required, but we need to clear the chroma planes.*/
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_mono_420jpeg;
  } else {
    fprintf(stderr, "Unknown chroma sampling type: %s\n", y4m_ctx->chroma_type);
    return -1;
  }
  /*The size of the final frame buffers is always computed from the
     destination chroma decimation type.*/
  y4m_ctx->dst_buf_sz =
      y4m_ctx->pic_w * y4m_ctx->pic_h +
      2 * ((y4m_ctx->pic_w + y4m_ctx->dst_c_dec_h - 1) / y4m_ctx->dst_c_dec_h) *
          ((y4m_ctx->pic_h + y4m_ctx->dst_c_dec_v - 1) / y4m_ctx->dst_c_dec_v);
  if (y4m_ctx->bit_depth == 8)
    y4m_ctx->dst_buf = (unsigned char *)malloc(y4m_ctx->dst_buf_sz);
  else
    y4m_ctx->dst_buf = (unsigned char *)malloc(2 * y4m_ctx->dst_buf_sz);
  if (!y4m_ctx->dst_buf) return -1;

  if (y4m_ctx->aux_buf_sz > 0) {
    y4m_ctx->aux_buf = (unsigned char *)malloc(y4m_ctx->aux_buf_sz);
    if (!y4m_ctx->aux_buf) {
      free(y4m_ctx->dst_buf);
      return -1;
    }
  }
  return 0;
}